

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  fdtd_type fVar1;
  undefined1 auVar2 [16];
  FILE *__stream;
  char *fileName;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  long val;
  int iVar5;
  float_type *pfVar6;
  undefined1 verbose;
  ulong uVar7;
  fdtd *__return_storage_ptr__;
  double extraout_XMM0_Qa;
  double dVar8;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  float_type Sc;
  uint setup_id;
  uint border_cpml_width;
  float_type end_time;
  float_type smallest_wavelength;
  size_t num_iterations;
  float_type domain_size [3];
  time_measure startTime;
  time_measure endTime;
  fdtd fdtd;
  double local_290;
  double local_288;
  uint local_280;
  uint local_27c;
  char *local_278;
  double local_270;
  float_type local_268;
  undefined8 local_260;
  float_type local_258;
  double dStack_250;
  double local_248;
  float_type local_240;
  timespec local_238;
  timespec local_228;
  undefined1 local_218 [8];
  fdtd3D local_210;
  
  local_278 = (char *)0x0;
  local_248 = 1e-05;
  local_27c = 0x14;
  local_290 = -1.0;
  local_268 = 4.5e-07;
  local_280 = 0;
  local_258 = 1e-05;
  dStack_250 = 1e-05;
  local_270 = -1.0;
  local_260 = 400;
  local_288 = (double)CONCAT44(local_288._4_4_,(int)CONCAT71((int7)((ulong)&local_260 >> 8),1));
  iVar3 = 1;
LAB_00102638:
  do {
    iVar5 = iVar3;
    iVar4 = getopt_long(argc,argv,":123s:x:y:z:o:c:w:a:t:i:hq",opt_options,0);
    iVar3 = iVar5;
    if (0x32 < iVar4) {
      switch(iVar4) {
      case 0x61:
        iVar4 = __isoc99_sscanf(_optarg,"%u",&local_27c);
        if (1 < iVar4 + 1U) goto LAB_00102638;
        main_cold_6();
        break;
      case 0x62:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x72:
      case 0x75:
      case 0x76:
        break;
      case 99:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_290);
        if ((1 < iVar4 + 1U) && (0.0 <= local_290)) goto LAB_00102638;
        main_cold_3();
        break;
      case 0x68:
        printf("Usage: %s <options>\n%s\n",*argv,
               "Options:\n  -1 --one-dimensional     : 1D solver\n  -2 --one-dimensional     : 2D solver\n  -3 --one-dimensional     : 3D solver\n  -s --setup-id            : Predefined problem identifier\n                             1D : 0 - Half air half water, left-to-right gaussian\n                             2D : 0 - West air east water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object, west pulse\n                                  2 - Centered gaussian excitation in free space\n                             3D : 0 - Half air half water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object\n  -x --size-x              : Size of the domain (e.g. 0.00001)\n  -y --size-y              : Size of the domain (e.g. 0.00001)\n  -z --size-z              : Size of the domain (e.g. 0.00001)\n  -o --output              : Select the output file name\n  -c --courant-friedrichs-levy-condition : Stability value\n  -w --smallest-wavelength : Smallest wavelength in the simulation\n  -a --cpml-absorbing-thickness  : Size of the absorbing boundary wall\n  -t --stop-sim-time       : Stop the simulation when the time is reached\n  -i --num-iterations      : Stop the simulation after the specified amount of solver iterations\n  -h --help                : Print this help\n  -q --quiet               : Do not print information to the user from inside the main kernel"
              );
        return 0;
      case 0x69:
        iVar4 = __isoc99_sscanf(_optarg,"%zu",&local_260);
        if (1 < iVar4 + 1U) goto LAB_00102638;
        main_cold_4();
        break;
      case 0x6f:
        local_278 = "gridData.dat";
        if ((_optarg == (char *)0x0) ||
           ((*_optarg != '-' && (local_278 = _optarg, *_optarg != '\0')))) goto LAB_00102638;
        _optind = _optind + -1;
        local_278 = "gridData.dat";
        break;
      case 0x71:
        local_288 = (double)((ulong)local_288 & 0xffffffff00000000);
        break;
      case 0x73:
        iVar4 = __isoc99_sscanf(_optarg,"%u",&local_280);
        if (1 < iVar4 + 1U) goto LAB_00102638;
        main_cold_5();
        break;
      case 0x74:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_270);
        if ((1 < iVar4 + 1U) && (0.0 <= local_270)) goto LAB_00102638;
        main_cold_2();
        break;
      case 0x77:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_268);
        if ((1 < iVar4 + 1U) && (0.0 <= local_268)) goto LAB_00102638;
        main_cold_1();
        break;
      case 0x78:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_258);
        if ((1 < iVar4 + 1U) && (0.0 <= local_258)) goto LAB_00102638;
        main_cold_9();
        break;
      case 0x79:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&dStack_250);
        if ((1 < iVar4 + 1U) && (0.0 <= dStack_250)) goto LAB_00102638;
        main_cold_8();
        break;
      case 0x7a:
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_248);
        if ((1 < iVar4 + 1U) && (0.0 <= local_248)) goto LAB_00102638;
        main_cold_7();
        break;
      default:
        if (iVar4 == 0x33) {
          iVar3 = 3;
        }
        goto LAB_00102638;
      }
      goto LAB_00102638;
    }
    iVar3 = 1;
    if (iVar4 == 0x31) goto LAB_00102638;
    if (iVar4 == 0x32) {
      iVar3 = 2;
      goto LAB_00102638;
    }
    iVar3 = iVar5;
  } while (iVar4 != -1);
  uVar7 = (ulong)local_280;
  dVar8 = extraout_XMM0_Qa;
  if (iVar5 == 3) {
    if (1 < local_280) {
LAB_00102c33:
      main_cold_10();
LAB_00102c3a:
      __return_storage_ptr__ = (fdtd *)(uVar7 & 0xffffffff);
      main_cold_12();
      verbose = (undefined1)uVar7;
      goto LAB_00102c41;
    }
    uVar7 = (ulong)(local_280 | 6);
    if ((local_290 == -1.0) && (!NAN(local_290))) {
      local_290 = 0.5;
    }
  }
  else if (iVar5 == 2) {
    if (2 < local_280) {
      main_cold_11();
      goto LAB_00102c33;
    }
    uVar7 = (ulong)(local_280 + 2);
    if ((local_290 == -1.0) && (!NAN(local_290))) {
      local_290 = 0.5773502691896258;
    }
  }
  else {
    if (local_280 != 0) goto LAB_00102c3a;
    uVar7 = 0;
    if ((local_290 == -1.0) && (uVar7 = 0, !NAN(local_290))) {
      local_290 = 1.0;
      uVar7 = 0;
    }
  }
  __return_storage_ptr__ = (fdtd *)local_218;
  initializeFdtd_cmpl(__return_storage_ptr__,(uint)uVar7,&local_258,local_290,local_268,
                      (ulong)local_27c);
  verbose = (undefined1)uVar7;
  local_240 = local_270;
  if (local_270 <= 0.0) {
    auVar2._8_8_ = in_XMM2_Qb;
    auVar2._0_8_ = in_XMM2_Qa;
    auVar2 = vcvtusi2sd_avx512f(auVar2,local_260);
    dVar8 = auVar2._0_8_;
    pfVar6 = (float_type *)(local_218 + 0x10);
    if (((local_218._0_4_ != fdtd_one_dim) &&
        (pfVar6 = &local_210.dt, local_218._0_4_ != fdtd_three_dims)) &&
       (pfVar6 = &local_210.dz, local_218._0_4_ != fdtd_two_dims)) {
LAB_00102c41:
      main_cold_13();
      fVar1 = __return_storage_ptr__->type;
      if (fVar1 == fdtd_three_dims) {
        run_3D_fdtd(&(__return_storage_ptr__->field_1).threeDims,dVar8,(_Bool)verbose);
        return extraout_EAX_01;
      }
      if (fVar1 != fdtd_two_dims) {
        if (fVar1 == fdtd_one_dim) {
          run_1D_fdtd(&(__return_storage_ptr__->field_1).oneDim,dVar8,(_Bool)verbose);
          return extraout_EAX;
        }
        return fVar1;
      }
      run_2D_fdtd(&(__return_storage_ptr__->field_1).twoDims,dVar8,(_Bool)verbose);
      return extraout_EAX_00;
    }
    local_240 = dVar8 * *pfVar6;
  }
  clock_gettime(4,&local_238);
  if (local_218._0_4_ == fdtd_three_dims) {
    run_3D_fdtd((fdtd3D *)(local_218 + 8),local_240,(_Bool)(local_288._0_1_ & 1));
  }
  else if (local_218._0_4_ == fdtd_two_dims) {
    run_2D_fdtd((fdtd2D *)(local_218 + 8),local_240,(_Bool)(local_288._0_1_ & 1));
  }
  else if (local_218._0_4_ == fdtd_one_dim) {
    run_1D_fdtd((fdtd1D *)(local_218 + 8),local_240,(_Bool)(local_288._0_1_ & 1));
  }
  clock_gettime(4,&local_228);
  fileName = local_278;
  __stream = _stdout;
  if (local_228.tv_nsec < local_238.tv_nsec) {
    local_288 = (double)((local_228.tv_nsec - local_238.tv_nsec) + 1000000000) / 1000000000.0 + -1.0
    ;
  }
  else {
    local_288 = (double)(local_228.tv_nsec - local_238.tv_nsec) / 1000000000.0;
  }
  dVar8 = difftime(local_228.tv_sec,local_238.tv_sec);
  fprintf(__stream,"Kernel time %.4fs\n",dVar8 + local_288);
  if (fileName != (char *)0x0) {
    if (local_218._0_4_ == fdtd_three_dims) {
      dump_3D_fdtd((fdtd3D *)(local_218 + 8),fileName,dump_ez);
    }
    else if (local_218._0_4_ == fdtd_two_dims) {
      dump_2D_fdtd((fdtd2D *)(local_218 + 8),fileName,dump_ez);
    }
    else if (local_218._0_4_ == fdtd_one_dim) {
      dump_1D_fdtd((fdtd1D *)(local_218 + 8),fileName,dump_ez);
    }
  }
  if (local_218._0_4_ == fdtd_three_dims) {
    free_3D_fdtd((fdtd3D *)(local_218 + 8));
  }
  else if (local_218._0_4_ == fdtd_two_dims) {
    free_2D_fdtd((fdtd2D *)(local_218 + 8));
  }
  else if (local_218._0_4_ == fdtd_one_dim) {
    free_1D_fdtd((fdtd1D *)(local_218 + 8));
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  float_type domain_size[3] = {default_domain_size, default_domain_size,
                               default_domain_size};
  char *output_filename = NULL;
  float_type Sc = default_Sc;
  float_type smallest_wavelength = default_smallest_wavelength;
  unsigned border_cpml_width = default_cpml_width;
  unsigned dimension = 1;
  unsigned setup_id = 0; // Default to the first one for each the dimension
  float_type end_time = default_end_time;
  size_t num_iterations = default_iteration_count;
  bool verbose = true;

  while (true) {
    int sscanf_return;
    int optchar = getopt_long(argc, argv, options, opt_options, NULL);
    if (optchar == -1)
      break;
    switch (optchar) {
    case '1':
      dimension = 1;
      break;
    case '2':
      dimension = 2;
      break;
    case '3':
      dimension = 3;
      break;
    case 'o':
      if (optarg != NULL && optarg[0] != '-' && optarg[0] != '\0') {
        output_filename = optarg;
      } else {
        output_filename = "gridData.dat";
        if (optarg != NULL)
          optind--;
      }
      break;
    case 'q':
      verbose = false;
      break;
    case 'x':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[0]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[0]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[0] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[0] = default_domain_size;
      }
      break;
    case 'y':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[1]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[1]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[1] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[1] = default_domain_size;
      }
      break;
    case 'z':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[2]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[2]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[2] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[2] = default_domain_size;
      }
      break;
    case 'a':
      sscanf_return = sscanf(optarg, "%u", &border_cpml_width);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the cpml thickness "
                "instead of \"-%c %s\"\n",
                optchar, optarg);
        border_cpml_width = default_cpml_width;
      }
      break;
    case 's':
      sscanf_return = sscanf(optarg, "%u", &setup_id);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the setup id instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        setup_id = 0;
      }
      break;
    case 'i':
      sscanf_return = sscanf(optarg, "%zu", &num_iterations);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the number of iterations "
                "instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        num_iterations = 0;
      }
      break;
    case 'c':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &Sc);
#else
      sscanf_return = sscanf(optarg, "%f", &Sc);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 || Sc < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        Sc = default_Sc;
      }
      break;
    case 't':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &end_time);
#else
      sscanf_return = sscanf(optarg, "%f", &end_time);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          end_time < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the "
                "simulation end time instead of \"-%c %s\"\n",
                optchar, optarg);
        end_time = default_end_time;
      }
      break;
    case 'w':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &smallest_wavelength);
#else
      sscanf_return = sscanf(optarg, "%f", &smallest_wavelength);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          smallest_wavelength < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        smallest_wavelength = default_smallest_wavelength;
      }
      break;
    case 'h':
      printf("Usage: %s <options>\n%s\n", argv[0], help_string);
      return EXIT_SUCCESS;
    }
  }

  unsigned initialize_setup_id;
  switch (dimension) {
  case 1: {
    if (setup_id >= last_1D_setup) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 1D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id;
    if (Sc == default_Sc) {
      Sc = float_cst(1.);
    }
  } break;
  case 2: {
    if (setup_id >= last_2D_setup - last_1D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 2D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_1D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(3.));
    }
  } break;
  case 3: {
    if (setup_id >= last_3D_setup - last_2D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 3D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_2D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(4.));
    }
  } break;
  }

  struct fdtd fdtd =
      initializeFdtd_cmpl(initialize_setup_id, domain_size, Sc,
                          smallest_wavelength, border_cpml_width);

  float_type stop_time;
  if (end_time > float_cst(0.)) {
    stop_time = end_time;
  } else {
    stop_time = (float_type)num_iterations * get_time_step_fdtd(&fdtd);
  }
  time_measure startTime, endTime;
  get_current_time(&startTime);
  run_fdtd(&fdtd, stop_time, verbose);
  get_current_time(&endTime);
  fprintf(stdout, "Kernel time %.4fs\n",
          measuring_difftime(startTime, endTime));
  if (output_filename) {
    dump_fdtd(&fdtd, output_filename, dump_ez);
  }
  free_fdtd(&fdtd);

  return EXIT_SUCCESS;
}